

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_seqToCodes(seqStore_t *seqStorePtr)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  U32 UVar7;
  long *in_RDI;
  U32 mlv;
  U32 llv;
  U32 u;
  U32 nbSeq;
  BYTE *mlCodeTable;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  seqDef *sequences;
  uint local_30;
  
  lVar1 = *in_RDI;
  lVar2 = in_RDI[4];
  lVar3 = in_RDI[6];
  lVar4 = in_RDI[5];
  lVar5 = in_RDI[1];
  lVar6 = *in_RDI;
  for (local_30 = 0; local_30 < (uint)(lVar5 - lVar6 >> 3); local_30 = local_30 + 1) {
    UVar7 = ZSTD_LLcode(0);
    *(char *)(lVar2 + (ulong)local_30) = (char)UVar7;
    UVar7 = ZSTD_highbit32(*(U32 *)(lVar1 + (ulong)local_30 * 8));
    *(char *)(lVar3 + (ulong)local_30) = (char)UVar7;
    UVar7 = ZSTD_MLcode(0);
    *(char *)(lVar4 + (ulong)local_30) = (char)UVar7;
  }
  if ((int)in_RDI[7] == 1) {
    *(undefined1 *)(lVar2 + (ulong)*(uint *)((long)in_RDI + 0x3c)) = 0x23;
  }
  if ((int)in_RDI[7] == 2) {
    *(undefined1 *)(lVar4 + (ulong)*(uint *)((long)in_RDI + 0x3c)) = 0x34;
  }
  return;
}

Assistant:

void ZSTD_seqToCodes(const seqStore_t* seqStorePtr)
{
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    BYTE* const llCodeTable = seqStorePtr->llCode;
    BYTE* const ofCodeTable = seqStorePtr->ofCode;
    BYTE* const mlCodeTable = seqStorePtr->mlCode;
    U32 const nbSeq = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    U32 u;
    for (u=0; u<nbSeq; u++) {
        U32 const llv = sequences[u].litLength;
        U32 const mlv = sequences[u].matchLength;
        llCodeTable[u] = (BYTE)ZSTD_LLcode(llv);
        ofCodeTable[u] = (BYTE)ZSTD_highbit32(sequences[u].offset);
        mlCodeTable[u] = (BYTE)ZSTD_MLcode(mlv);
    }
    if (seqStorePtr->longLengthID==1)
        llCodeTable[seqStorePtr->longLengthPos] = MaxLL;
    if (seqStorePtr->longLengthID==2)
        mlCodeTable[seqStorePtr->longLengthPos] = MaxML;
}